

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O0

void __thiscall
diy::Master::iexchange<bool(*)(Block*,diy::Master::ProxyWithLink_const&)>
          (Master *this,_func_bool_Block_ptr_ProxyWithLink_ptr **f,MemoryManagement *mem)

{
  MemoryManagement *in_RDX;
  MemoryManagement *in_stack_000003b0;
  ICallback<Block> *in_stack_000003b8;
  Master *in_stack_000003c0;
  _func_bool_Block_ptr_ProxyWithLink_ptr **in_stack_ffffffffffffff58;
  function<bool_(Block_*,_const_diy::Master::ProxyWithLink_&)> *in_stack_ffffffffffffff60;
  MemoryManagement *in_stack_ffffffffffffff68;
  MemoryManagement *in_stack_ffffffffffffff70;
  
  std::function<bool(Block*,diy::Master::ProxyWithLink_const&)>::
  function<bool(*const&)(Block*,diy::Master::ProxyWithLink_const&),void>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  MemoryManagement::MemoryManagement(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  iexchange_<Block>(in_stack_000003c0,in_stack_000003b8,in_stack_000003b0);
  MemoryManagement::~MemoryManagement(in_RDX);
  std::function<bool_(Block_*,_const_diy::Master::ProxyWithLink_&)>::~function
            ((function<bool_(Block_*,_const_diy::Master::ProxyWithLink_&)> *)0x1105e5);
  return;
}

Assistant:

void          iexchange(const F& f, MemoryManagement mem = MemoryManagement())
      {
          using Block = typename detail::block_traits<F>::type;
          iexchange_<Block>(f, mem);
      }